

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O0

void Extra_BitMatrixPrint(Extra_BitMat_t *pMat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_18;
  int nVars;
  int k;
  int i;
  Extra_BitMat_t *pMat_local;
  
  printf("\n");
  iVar2 = Extra_BitMatrixReadSize(pMat);
  for (nVars = 0; nVars < iVar2; nVars = nVars + 1) {
    for (local_18 = 0; iVar1 = nVars, local_18 <= nVars; local_18 = local_18 + 1) {
      printf(" ");
    }
    while (local_18 = iVar1 + 1, local_18 < iVar2) {
      iVar3 = Extra_BitMatrixLookup1(pMat,nVars,local_18);
      iVar1 = local_18;
      if (iVar3 == 0) {
        printf(".");
      }
      else {
        printf("1");
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Extra_BitMatrixPrint( Extra_BitMat_t * pMat )
{
    int i, k, nVars;
    printf( "\n" );
    nVars = Extra_BitMatrixReadSize( pMat );
    for ( i = 0; i < nVars; i++ )
    {
        for ( k = 0; k <= i; k++ )
            printf( " " );
        for ( k = i+1; k < nVars; k++ )
            if ( Extra_BitMatrixLookup1( pMat, i, k ) )
                printf( "1" );
            else
                printf( "." );
        printf( "\n" );
    }
}